

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.hpp
# Opt level: O0

string * psst::util::demangle<afsm::test::events::commit>(void)

{
  char *pcVar1;
  string *in_RDI;
  allocator local_22;
  undefined1 local_21;
  char *local_20;
  char *ret;
  int status;
  string *res;
  
  ret._4_4_ = 0;
  pcVar1 = std::type_info::name((type_info *)&afsm::test::events::commit::typeinfo);
  pcVar1 = (char *)__cxa_demangle(pcVar1,0,0,(long)&ret + 4);
  local_21 = 0;
  local_20 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  if (local_20 != (char *)0x0) {
    free(local_20);
  }
  return in_RDI;
}

Assistant:

::std::string
demangle()
{
    int status {0};

    /*
     * Demangle the type name if using non-portable GNU extensions.
     */
    #ifdef HAS_GNU_EXTENSIONS_
    char* ret = abi::__cxa_demangle( typeid(T).name(), nullptr, nullptr, &status );
    ::std::string res{ret};
    if(ret) free(ret);
    #else
    ::std::string res{ typeid(T).name() };
    #endif
    return res;
}